

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

void __thiscall testing::InSequence::InSequence(InSequence *this)

{
  Sequence *pSVar1;
  Sequence **ppSVar2;
  Sequence *this_00;
  
  ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                      ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
  pSVar1 = *ppSVar2;
  if (pSVar1 == (Sequence *)0x0) {
    this_00 = (Sequence *)operator_new(0x10);
    Sequence::Sequence(this_00);
    ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                        ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
    *ppSVar2 = this_00;
  }
  this->sequence_created_ = pSVar1 == (Sequence *)0x0;
  return;
}

Assistant:

InSequence::InSequence() {
  if (internal::g_gmock_implicit_sequence.get() == NULL) {
    internal::g_gmock_implicit_sequence.set(new Sequence);
    sequence_created_ = true;
  } else {
    sequence_created_ = false;
  }
}